

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O1

int scv_i_grow(scv_vector *v,size_t capacity)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  
  if (v->data == (void *)0x0) {
    __assert_fail("v->data != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x3b,
                  "int scv_i_grow(struct scv_vector *, size_t)");
  }
  uVar9 = v->capacity;
  iVar4 = 0;
  if (uVar9 < capacity) {
    uVar1 = v->objsize;
    if (uVar1 == 0) {
      __assert_fail("v->objsize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x41,
                    "int scv_i_grow(struct scv_vector *, size_t)");
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar5 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0);
    iVar4 = -3;
    if (capacity < uVar5) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar1;
      if (uVar9 < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / auVar3,0)) {
        lVar7 = uVar9 * 2;
      }
      else {
        lVar7 = (uVar9 >> 1) + uVar9;
      }
      uVar6 = lVar7 + 1;
      uVar9 = capacity;
      if (capacity < uVar6) {
        uVar9 = uVar6;
      }
      if (uVar5 <= uVar6) {
        uVar9 = capacity;
      }
      pvVar8 = realloc(v->data,uVar1 * uVar9);
      if (pvVar8 == (void *)0x0) {
        iVar4 = -2;
      }
      else {
        v->data = pvVar8;
        v->capacity = uVar9;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int scv_i_grow(struct scv_vector *v, size_t capacity)
{
	void *newdata;
	size_t newcapacity;

	assert(v != NULL);
	assert(v->data != NULL);

	if (capacity <= v->capacity) {
		return SCV_OK;
	}

	assert(v->objsize > 0);

	if (capacity >= (size_t) -1 / v->objsize) {
		return SCV_ERANGE;
	}

	/* Growth factor 2 for small vectors, 1.5 for larger */
	if (v->capacity < 4096 / v->objsize) {
		newcapacity = v->capacity + v->capacity + 1;
	}
	else {
		newcapacity = v->capacity + v->capacity / 2 + 1;
	}

	if (capacity > newcapacity || newcapacity >= (size_t) -1 / v->objsize) {
		newcapacity = capacity;
	}

	newdata = realloc(v->data, newcapacity * v->objsize);

	if (newdata == NULL) {
		return SCV_ENOMEM;
	}

	v->data = newdata;
	v->capacity = newcapacity;

	return SCV_OK;
}